

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

uint64_t sum_quotients_vec<short,libdivide::divider<short,(libdivide::Branching)0>>
                   (random_numerators<short> *vals,divider<short,_(libdivide::Branching)0> *div)

{
  uint32_t *puVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  size_t i;
  uint32_t *puVar5;
  UIntT sum;
  ushort uVar6;
  int32_t yl;
  short sVar7;
  short sVar8;
  byte bVar9;
  long lVar10;
  undefined1 auVar11 [64];
  type_pun_vec result;
  undefined1 local_140 [64];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [2] [64];
  
  auVar11 = ZEXT1664((undefined1  [16])0x0);
  local_140 = vmovdqa64_avx512f(auVar11);
  if ((ulong)vals->_length != 0) {
    puVar5 = vals->_pData;
    puVar1 = (uint32_t *)((long)puVar5 + (ulong)vals->_length * 2);
    sVar3 = (div->div).denom.magic;
    bVar2 = (div->div).denom.more;
    bVar9 = bVar2 & 0x1f;
    uVar6 = 0xffff;
    if (-1 < (char)bVar2) {
      uVar6 = 0;
    }
    do {
      local_100 = *(undefined8 *)puVar5;
      uStack_f8 = *(undefined8 *)(puVar5 + 2);
      uStack_f0 = *(undefined8 *)(puVar5 + 4);
      uStack_e8 = *(undefined8 *)(puVar5 + 6);
      uStack_e0 = *(undefined8 *)(puVar5 + 8);
      uStack_d8 = *(undefined8 *)(puVar5 + 10);
      uStack_d0 = *(undefined8 *)(puVar5 + 0xc);
      uStack_c8 = *(undefined8 *)(puVar5 + 0xe);
      lVar10 = 0;
      do {
        uVar4 = *(ushort *)((long)&local_100 + lVar10 * 2);
        if (sVar3 == 0) {
          sVar8 = ((ushort)((int)(short)(((ushort)((uint)(int)(short)uVar4 >> 0xf) &
                                         ~(ushort)(-1 << bVar9)) + uVar4) >> bVar9) ^ uVar6) - uVar6
          ;
        }
        else {
          sVar7 = (short)((uint)((int)(short)uVar4 * (int)sVar3) >> 0x10);
          sVar8 = (sVar7 - ((char)bVar2 >> 7)) + (uVar4 ^ (short)((char)bVar2 >> 7));
          if ((bVar2 & 0x40) == 0) {
            sVar8 = sVar7;
          }
          sVar8 = (short)((int)sVar8 >> bVar9) - (sVar8 >> 0xf);
        }
        *(short *)(local_c0[0] + lVar10 * 2) = sVar8;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x20);
      auVar11 = vpaddw_avx512bw(auVar11,local_c0[0]);
      puVar5 = puVar5 + 0x10;
    } while (puVar5 != puVar1);
  }
  local_140 = vmovdqa64_avx512f(auVar11);
  lVar10 = 0;
  uVar6 = 0;
  do {
    uVar6 = uVar6 + *(short *)(local_140 + lVar10 * 2);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x20);
  return (ulong)uVar6;
}

Assistant:

NOINLINE uint64_t sum_quotients_vec(const random_numerators<IntT> &vals, const Divisor &div) {
    size_t count = sizeof(x86_VECTOR_TYPE) / sizeof(IntT);
    x86_VECTOR_TYPE sumX4 = SETZERO_SI();
    for (auto iter = vals.begin(); iter != vals.end(); iter += count) {
        x86_VECTOR_TYPE numers = LOAD_SI((const x86_VECTOR_TYPE *)iter);
        numers = numers / div;
        sumX4 = add_vector<sizeof(IntT)>(sumX4, numers);
    }
    return unsigned_sum_vals((const IntT *)&sumX4, count);
}